

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O2

void __thiscall arm::ArmCode::display(ArmCode *this,ostream *o)

{
  pointer puVar1;
  Function *pFVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *f;
  pointer puVar5;
  
  poVar3 = std::operator<<(o,".text");
  std::endl<char,std::char_traits<char>>(poVar3);
  puVar1 = (this->functions).
           super__Vector_base<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (this->functions).
                super__Vector_base<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    pFVar2 = (puVar5->_M_t).
             super___uniq_ptr_impl<arm::Function,_std::default_delete<arm::Function>_>._M_t.
             super__Tuple_impl<0UL,_arm::Function_*,_std::default_delete<arm::Function>_>.
             super__Head_base<0UL,_arm::Function_*,_false>._M_head_impl;
    (**(pFVar2->super_Displayable)._vptr_Displayable)(pFVar2,o);
    std::endl<char,std::char_traits<char>>(o);
  }
  poVar3 = std::operator<<(o,".data");
  std::endl<char,std::char_traits<char>>(poVar3);
  for (p_Var4 = (this->consts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->consts)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    poVar3 = std::operator<<(o,(string *)(p_Var4 + 1));
    poVar3 = std::operator<<(poVar3,":");
    std::endl<char,std::char_traits<char>>(poVar3);
    (*(code *)**(undefined8 **)(p_Var4 + 2))(p_Var4 + 2,o);
    std::endl<char,std::char_traits<char>>(o);
  }
  std::endl<char,std::char_traits<char>>(o);
  return;
}

Assistant:

void ArmCode::display(std::ostream &o) const {
  o << ".text" << std::endl;
  for (auto &f : functions) {
    o << *f << std::endl;
  }

  o << ".data" << std::endl;
  for (auto &v : this->consts) {
    o << v.first << ":" << std::endl;
    o << v.second << std::endl;
  }
  o << std::endl;
}